

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btGImpactCollisionAlgorithm::gimpact_vs_compoundshape
          (btGImpactCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btGImpactShapeInterface *shape0,
          btCompoundShape *shape1,bool swapped)

{
  btTransform *pbVar1;
  btCompoundShapeChild *pbVar2;
  btCollisionShape *shape1_00;
  btManifoldResult *pbVar3;
  btCollisionObjectWrapper **ppbVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  btCollisionObjectWrapper *pbVar8;
  bool bVar9;
  btCollisionObjectWrapper ob1;
  btTransform orgtrans1;
  btTransform childtrans1;
  btCollisionObjectWrapper local_e0;
  btTransform local_b8;
  btTransform local_70;
  
  pbVar1 = body1Wrap->m_worldTransform;
  local_b8.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats;
  local_b8.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[0].m_floats + 2);
  local_b8.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[1].m_floats;
  local_b8.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[1].m_floats + 2);
  local_b8.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[2].m_floats;
  local_b8.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[2].m_floats + 2);
  local_b8.m_origin.m_floats._0_8_ = *(undefined8 *)(pbVar1->m_origin).m_floats;
  local_b8.m_origin.m_floats._8_8_ = *(undefined8 *)((pbVar1->m_origin).m_floats + 2);
  iVar7 = (shape1->m_children).m_size;
  lVar5 = (long)iVar7;
  lVar6 = lVar5 * 0x58;
  while( true ) {
    iVar7 = iVar7 + -1;
    bVar9 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar9) break;
    pbVar2 = (shape1->m_children).m_data;
    shape1_00 = *(btCollisionShape **)((long)(&pbVar2[-1].m_transform + 1) + lVar6);
    btTransform::operator*
              (&local_70,&local_b8,
               (btTransform *)((long)pbVar2[-1].m_transform.m_basis.m_el[0].m_floats + lVar6));
    local_e0.m_collisionObject = body1Wrap->m_collisionObject;
    local_e0.m_partId = -1;
    pbVar3 = this->m_resultOut;
    pbVar8 = pbVar3->m_body0Wrap;
    if (pbVar8->m_collisionObject == local_e0.m_collisionObject) {
      ppbVar4 = &pbVar3->m_body0Wrap;
    }
    else {
      pbVar8 = pbVar3->m_body1Wrap;
      ppbVar4 = &pbVar3->m_body1Wrap;
    }
    *ppbVar4 = &local_e0;
    local_e0.m_parent = body1Wrap;
    local_e0.m_shape = shape1_00;
    local_e0.m_worldTransform = &local_70;
    local_e0.m_index = iVar7;
    gimpact_vs_shape(this,body0Wrap,&local_e0,shape0,shape1_00,swapped);
    (&this->m_resultOut->m_body0Wrap)
    [this->m_resultOut->m_body0Wrap->m_collisionObject != local_e0.m_collisionObject] = pbVar8;
    lVar6 = lVar6 + -0x58;
  }
  return;
}

Assistant:

void btGImpactCollisionAlgorithm::gimpact_vs_compoundshape(const btCollisionObjectWrapper* body0Wrap,
				  const btCollisionObjectWrapper* body1Wrap,
				  const btGImpactShapeInterface * shape0,
				  const btCompoundShape * shape1,bool swapped)
{
	btTransform orgtrans1 = body1Wrap->getWorldTransform();

	int i = shape1->getNumChildShapes();
	while(i--)
	{

		const btCollisionShape * colshape1 = shape1->getChildShape(i);
		btTransform childtrans1 = orgtrans1*shape1->getChildTransform(i);

		btCollisionObjectWrapper ob1(body1Wrap,colshape1,body1Wrap->getCollisionObject(),childtrans1,-1,i);
		
		const btCollisionObjectWrapper* tmp = 0;
		if (m_resultOut->getBody0Wrap()->getCollisionObject()==ob1.getCollisionObject())
		{
			tmp = m_resultOut->getBody0Wrap();
			m_resultOut->setBody0Wrap(&ob1);
		} else
		{
			tmp = m_resultOut->getBody1Wrap();
			m_resultOut->setBody1Wrap(&ob1);
		}
		//collide child shape
		gimpact_vs_shape(body0Wrap, &ob1,
					  shape0,colshape1,swapped);

		if (m_resultOut->getBody0Wrap()->getCollisionObject()==ob1.getCollisionObject())
		{
			m_resultOut->setBody0Wrap(tmp);
		} else
		{
			m_resultOut->setBody1Wrap(tmp);
		}
	}
}